

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::log_internal::CheckOpMessageBuilder::CheckOpMessageBuilder
          (CheckOpMessageBuilder *this,Nonnull<const_char_*> exprtext)

{
  ostream *poVar1;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  poVar1 = std::operator<<((ostream *)this,exprtext);
  std::operator<<(poVar1," (");
  return;
}

Assistant:

CheckOpMessageBuilder::CheckOpMessageBuilder(
    absl::Nonnull<const char*> exprtext) {
  stream_ << exprtext << " (";
}